

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

uint32_t BYTE_MUL(uint32_t x,uint32_t a)

{
  uint uVar1;
  uint uVar2;
  uint32_t t;
  uint32_t a_local;
  uint32_t x_local;
  
  uVar1 = (x & 0xff00ff) * a;
  uVar2 = (x >> 8 & 0xff00ff) * a;
  return uVar1 + (uVar1 >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff |
         uVar2 + (uVar2 >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
}

Assistant:

static inline uint32_t BYTE_MUL(uint32_t x, uint32_t a)
{
    uint32_t t = (x & 0xff00ff) * a;
    t = (t + ((t >> 8) & 0xff00ff) + 0x800080) >> 8;
    t &= 0xff00ff;
    x = ((x >> 8) & 0xff00ff) * a;
    x = (x + ((x >> 8) & 0xff00ff) + 0x800080);
    x &= 0xff00ff00;
    x |= t;
    return x;
}